

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  cmGlobalGenerator *gg;
  string *psVar7;
  ostream *poVar8;
  char *__s;
  size_t sVar9;
  FILE *__stream;
  ulong uVar10;
  bool in_DL;
  uint uVar11;
  ulong uVar12;
  cmWorkingDirectory *pcVar13;
  bool bVar14;
  string destPath;
  string modulesPath;
  string resultFile;
  string inFile;
  string outFile;
  string cwd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string value;
  string local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  string local_10d8;
  string local_10b8;
  string local_1098;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  cmWorkingDirectory local_1038 [102];
  
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  local_10f8._M_string_length = 0;
  local_10f8.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_1098,(SystemTools *)0x1,in_DL);
  local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1138,local_1098._M_dataplus._M_p,
             local_1098._M_dataplus._M_p + local_1098._M_string_length);
  std::__cxx11::string::append((char *)&local_1138);
  cmsys::SystemTools::RemoveADirectory(&local_1138);
  bVar3 = cmsys::SystemTools::MakeDirectory(&local_1138,(mode_t *)0x0);
  if (bVar3) {
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar14 = (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x21;
    bVar3 = !bVar14;
    if (bVar14) {
      bVar14 = true;
    }
    else {
      bVar14 = true;
      uVar12 = 1;
      do {
        uVar11 = (uint)uVar12;
        psVar7 = pbVar5 + uVar12;
        lVar6 = std::__cxx11::string::find((char *)psVar7,0x4eae49,0);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)local_1038,(ulong)psVar7);
          if (local_1038[0].OldDir._M_string_length == 0) {
            uVar11 = uVar11 + 1;
            if ((ulong)uVar11 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)local_1038);
              goto LAB_0021e614;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar2 = false;
          }
          else {
LAB_0021e614:
            gg = CreateGlobalGenerator(this,&local_1038[0].OldDir);
            if (gg == (cmGlobalGenerator *)0x0) {
              std::operator+(&local_1118,"Could not create named generator ",&local_1038[0].OldDir);
              cmSystemTools::Error(&local_1118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
                operator_delete(local_1118._M_dataplus._M_p,
                                local_1118.field_2._M_allocated_capacity + 1);
              }
              bVar2 = true;
              PrintGeneratorList(this);
            }
            else {
              bVar2 = true;
              SetGlobalGenerator(this,gg);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0].OldDir._M_dataplus._M_p != &local_1038[0].OldDir.field_2) {
            operator_delete(local_1038[0].OldDir._M_dataplus._M_p,
                            local_1038[0].OldDir.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar14 = cmsys::SystemTools::FileIsFullPath(psVar7);
          if (!bVar14) {
            std::__cxx11::string::_M_assign((string *)&local_10f8);
            std::__cxx11::string::append((char *)&local_10f8);
          }
          std::__cxx11::string::_M_append((char *)&local_10f8,(ulong)(psVar7->_M_dataplus)._M_p);
          bVar2 = true;
          bVar14 = false;
        }
        if (!bVar2) break;
        uVar12 = (ulong)(uVar11 + 1);
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5;
        bVar3 = uVar12 < uVar10;
      } while (uVar12 < uVar10);
    }
    iVar4 = -1;
    if (!bVar3) {
      AddCMakePaths(this);
      psVar7 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1118,pcVar1,pcVar1 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_1118);
      local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_10d8,local_1118._M_dataplus._M_p,
                 local_1118._M_dataplus._M_p + local_1118._M_string_length);
      std::__cxx11::string::append((char *)&local_10d8);
      local_10b8._M_dataplus._M_p = (pointer)&local_10b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_10b8,local_1138._M_dataplus._M_p,
                 local_1138._M_dataplus._M_p + local_1138._M_string_length);
      std::__cxx11::string::append((char *)&local_10b8);
      bVar3 = cmsys::SystemTools::CopyFileAlways(&local_10d8,&local_10b8);
      if (bVar3) {
        if (local_10f8._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&local_10f8);
          std::__cxx11::string::append((char *)&local_10f8);
        }
        cmWorkingDirectory::cmWorkingDirectory(local_1038,&local_1138);
        if (local_1038[0].ResultCode == 0) {
          local_1078.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1078.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1078.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1078,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1078,&local_1138);
          std::operator+(&local_1058,"-DRESULT_FILE=",&local_10f8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &local_1078,&local_1058);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
            operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1
                           );
          }
          iVar4 = Run(this,&local_1078,false);
          bVar3 = iVar4 == 0;
          if (bVar3) {
            iVar4 = -1;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Error: --system-information failed on internal CMake!\n",0x36);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1078);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to change to directory ",0x1e);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_1138._M_dataplus._M_p,
                              local_1138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
          __s = strerror(local_1038[0].ResultCode);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
          }
          else {
            sVar9 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
          }
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar4 = 1;
          bVar3 = false;
        }
        cmWorkingDirectory::~cmWorkingDirectory(local_1038);
        if (bVar3) {
          if ((bVar14) &&
             (__stream = (FILE *)cmsys::SystemTools::Fopen(&local_10f8,"r"), __stream != (FILE *)0x0
             )) {
            sVar9 = fread(local_1038,1,0x1000,__stream);
            while (sVar9 != 0) {
              if (0 < (long)sVar9) {
                pcVar13 = local_1038;
                do {
                  putc((int)*(char *)&(pcVar13->OldDir)._M_dataplus._M_p,_stdout);
                  pcVar13 = (cmWorkingDirectory *)((long)&(pcVar13->OldDir)._M_dataplus._M_p + 1);
                } while (pcVar13 < (cmWorkingDirectory *)
                                   ((long)&local_1038[0].OldDir._M_dataplus._M_p + sVar9));
              }
              fflush(_stdout);
              sVar9 = fread(local_1038,1,0x1000,__stream);
            }
            fclose(__stream);
          }
          iVar4 = 0;
          cmsys::SystemTools::RemoveADirectory(&local_1138);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error copying file \"",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_10d8._M_dataplus._M_p,
                            local_10d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to \"",6);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_10b8._M_dataplus._M_p,local_10b8._M_string_length);
        iVar4 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
        operator_delete(local_10b8._M_dataplus._M_p,local_10b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
        operator_delete(local_10d8._M_dataplus._M_p,local_10d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
        operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    iVar4 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error: --system-information must be run from a writable directory!\n",0x43);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,
                    CONCAT71(local_10f8.field_2._M_allocated_capacity._1_7_,
                             local_10f8.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cwd;
        resultFile += "/";
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath = cmSystemTools::GetCMakeRoot();
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}